

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_0::ValidateUTF8(string *str)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *sEnd;
  char *s;
  string *str_local;
  
  s = (char *)str;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)str);
  sEnd = pcVar2;
  lVar3 = std::__cxx11::string::length();
  do {
    if (pcVar2 + lVar3 <= sEnd) {
      return true;
    }
    iVar1 = FromUTF8(&sEnd);
  } while (-1 < iVar1);
  return false;
}

Assistant:

static bool ValidateUTF8(const std::string &str) {
  const char *s = &str[0];
  const char *const sEnd = s + str.length();
  while (s < sEnd) {
    if (FromUTF8(&s) < 0) { return false; }
  }
  return true;
}